

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O3

Var Js::JavascriptArray::EntryPushNonJavascriptArray
              (ScriptContext *scriptContext,Var *args,uint argCount)

{
  Type TVar1;
  code *pcVar2;
  undefined1 auVar3 [8];
  undefined8 object;
  bool bVar4;
  BOOL BVar5;
  uint32 uVar6;
  Var pvVar7;
  undefined4 *puVar8;
  RecyclableObject *this;
  uint64 uVar9;
  uint64 uVar10;
  ScriptContext *scriptContext_00;
  ScriptContext *scriptContext_01;
  long lVar11;
  ulong uVar12;
  double value;
  undefined1 auVar13 [16];
  _func_int **pp_Stack_98;
  BigIndex n;
  undefined1 auStack_78 [8];
  BigIndex big;
  undefined1 local_60 [8];
  JsReentLock jsReentLock;
  RecyclableObject *obj;
  
  local_60 = (undefined1  [8])scriptContext->threadContext;
  jsReentLock.m_threadContext = (ThreadContext *)0x0;
  jsReentLock.m_arrayObject = (Var)0x0;
  jsReentLock.m_arrayObject2._0_1_ = ((ThreadContext *)local_60)->noJsReentrancy;
  ((ThreadContext *)local_60)->noJsReentrancy = true;
  jsReentLock.m_savedNoJsReentrancy = false;
  jsReentLock._25_7_ = 0;
  BVar5 = JavascriptConversion::ToObject
                    (*args,scriptContext,(RecyclableObject **)&jsReentLock.m_savedNoJsReentrancy);
  if (BVar5 == 0) {
    JavascriptError::ThrowTypeError(scriptContext,-0x7ff5ec42,L"Array.prototype.push");
  }
  JsReentLock::setObjectForMutation((JsReentLock *)local_60,(Var)jsReentLock._24_8_);
  *(undefined1 *)((long)local_60 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
  pvVar7 = JavascriptOperators::OP_GetLength((Var)jsReentLock._24_8_,scriptContext);
  if (pvVar7 == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar4) goto LAB_00b77a1e;
    *puVar8 = 0;
LAB_00b773f3:
    this = UnsafeVarTo<Js::RecyclableObject>(pvVar7);
    if (this == (RecyclableObject *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
      if (!bVar4) goto LAB_00b77a1e;
      *puVar8 = 0;
    }
    TVar1 = ((this->type).ptr)->typeId;
    if ((int)TVar1 < 0x58) {
      if (((TVar1 == TypeIds_Undefined) &&
          ((scriptContext->threadContext->disableImplicitFlags & DisableImplicitCallFlag) !=
           DisableImplicitNoFlag)) &&
         (scriptContext->threadContext->implicitCallFlags != ImplicitCall_None)) goto LAB_00b779fc;
    }
    else {
      BVar5 = RecyclableObject::IsExternal(this);
      if (BVar5 == 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar8 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                    "GetTypeId aValue has invalid TypeId");
        goto LAB_00b774d8;
      }
    }
  }
  else if (((ulong)pvVar7 & 0x1ffff00000000) == 0x1000000000000 ||
           ((ulong)pvVar7 & 0xffff000000000000) != 0x1000000000000) {
    if ((ulong)pvVar7 >> 0x32 == 0 && ((ulong)pvVar7 & 0xffff000000000000) != 0x1000000000000)
    goto LAB_00b773f3;
  }
  else {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
LAB_00b774d8:
    if (bVar4 == false) goto LAB_00b77a1e;
    *puVar8 = 0;
  }
  BigIndex::BigIndex((BigIndex *)&pp_Stack_98,0);
  if (((scriptContext->config).threadConfig)->m_ES6ToLength == true) {
    uVar9 = JavascriptConversion::ToLength(pvVar7,scriptContext);
    BigIndex::BigIndex((BigIndex *)auStack_78,uVar9);
    pp_Stack_98 = (_func_int **)auStack_78;
    n.index = big.index;
    n._4_4_ = big._4_4_;
  }
  else {
    if (((ulong)pvVar7 & 0x1ffff00000000) == 0x1000000000000 ||
        ((ulong)pvVar7 & 0xffff000000000000) != 0x1000000000000) {
      if (((ulong)pvVar7 & 0xffff000000000000) == 0x1000000000000) goto LAB_00b775c9;
      uVar6 = JavascriptConversion::ToUInt32_Full(pvVar7,scriptContext);
      pvVar7 = (Var)(ulong)uVar6;
    }
    else {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                  ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                  "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
      if (!bVar4) goto LAB_00b77a1e;
      *puVar8 = 0;
LAB_00b775c9:
      if (((ulong)pvVar7 & 0x1ffff00000000) != 0x1000000000000) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar8 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                    ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                    "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
        if (!bVar4) goto LAB_00b77a1e;
        *puVar8 = 0;
      }
    }
    BigIndex::BigIndex((BigIndex *)auStack_78,(uint32)pvVar7);
    pp_Stack_98 = (_func_int **)auStack_78;
    n.index = big.index;
    n._4_4_ = big._4_4_;
  }
  if (argCount < 2) {
    uVar6 = (uint32)pp_Stack_98;
  }
  else {
    uVar12 = 1;
    do {
      BigIndex::BigIndex((BigIndex *)auStack_78,0xffffffff);
      scriptContext_00 = (ScriptContext *)auStack_78;
      bVar4 = BigIndex::operator<((BigIndex *)&pp_Stack_98,(BigIndex *)auStack_78);
      object = jsReentLock._24_8_;
      if (!bVar4) {
        auStack_78 = (undefined1  [8])pp_Stack_98;
        auVar3 = auStack_78;
        big.index = n.index;
        big._4_4_ = n._4_4_;
        if (argCount <= (uint)uVar12) goto LAB_00b7793b;
        auStack_78._0_4_ = SUB84(pp_Stack_98,0);
        lVar11 = n._0_8_;
        uVar6 = auStack_78._0_4_;
        auStack_78 = auVar3;
        goto LAB_00b778d3;
      }
      *(undefined1 *)((long)local_60 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
      uVar6 = BigIndex::GetSmallIndex((BigIndex *)&pp_Stack_98);
      BVar5 = JavascriptOperators::SetItem
                        ((Var)object,(RecyclableObject *)object,uVar6,args[uVar12],scriptContext,
                         PropertyOperation_ThrowIfNotExtensible,0);
      JsReentLock::MutateArrayObject((JsReentLock *)local_60);
      *(bool *)((long)local_60 + 0x108) = true;
      if (BVar5 == 0) {
        bVar4 = ThreadContext::RecordImplicitException(scriptContext->threadContext);
        if (bVar4) {
          JavascriptError::ThrowTypeError(scriptContext,-0x7ff5fe43,L"Array.prototype.push");
        }
        goto LAB_00b779f9;
      }
      if ((uint32)pp_Stack_98 == 0xffffffff) {
        n._0_8_ = n._0_8_ + 1;
        uVar6 = 0xffffffff;
      }
      else {
        uVar6 = (uint32)pp_Stack_98 + 1;
        pp_Stack_98 = (_func_int **)CONCAT44(pp_Stack_98._4_4_,uVar6);
      }
      uVar12 = uVar12 + 1;
    } while (argCount != uVar12);
  }
  if (uVar6 == 0xffffffff) {
    uVar9 = BigIndex::GetBigIndex((BigIndex *)&pp_Stack_98);
  }
  else {
    uVar6 = BigIndex::GetSmallIndex((BigIndex *)&pp_Stack_98);
    uVar9 = (uint64)uVar6;
  }
  if (uVar9 < 0x80000000) {
    pvVar7 = (Var)(uVar9 | 0x1000000000000);
  }
  else {
    auVar13._8_4_ = (int)(uVar9 >> 0x20);
    auVar13._0_8_ = uVar9;
    auVar13._12_4_ = 0x45300000;
    value = ((double)CONCAT44(0x43300000,(int)uVar9) - 4503599627370496.0) +
            (auVar13._8_8_ - 1.9342813113834067e+25);
    uVar9 = NumberUtilities::ToSpecial(value);
    bVar4 = NumberUtilities::IsNan(value);
    if (((bVar4) && (uVar10 = NumberUtilities::ToSpecial(value), uVar10 != 0xfff8000000000000)) &&
       (uVar10 = NumberUtilities::ToSpecial(value), uVar10 != 0x7ff8000000000000)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/JavascriptNumber.inl"
                                  ,0xa2,
                                  "(!IsNan(value) || ToSpecial(value) == k_NegativeNan || ToSpecial(value) == 0x7FF8000000000000ull)"
                                  ,"We should only produce a NaN with this value");
      if (!bVar4) {
LAB_00b77a1e:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar8 = 0;
    }
    pvVar7 = (Var)(uVar9 ^ 0xfffc000000000000);
  }
  *(undefined1 *)((long)local_60 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
  BVar5 = JavascriptOperators::SetProperty
                    ((Var)jsReentLock._24_8_,(RecyclableObject *)jsReentLock._24_8_,0xd1,pvVar7,
                     scriptContext,PropertyOperation_ThrowIfNotExtensible);
  JsReentLock::MutateArrayObject((JsReentLock *)local_60);
  *(bool *)((long)local_60 + 0x108) = true;
  if (BVar5 != 0) goto LAB_00b779fc;
  bVar4 = ThreadContext::RecordImplicitException(scriptContext->threadContext);
  if (bVar4) {
    JavascriptError::ThrowTypeError(scriptContext,-0x7ff5fe43,L"Array.prototype.push");
  }
  goto LAB_00b779f9;
  while( true ) {
    if (uVar6 == 0xffffffff) {
      lVar11 = lVar11 + 1;
      uVar6 = 0xffffffff;
      big._0_8_ = lVar11;
    }
    else {
      uVar6 = uVar6 + 1;
      auStack_78._0_4_ = uVar6;
    }
    uVar12 = uVar12 + 1;
    if (argCount == (uint)uVar12) break;
LAB_00b778d3:
    *(undefined1 *)((long)local_60 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
    scriptContext_00 = (ScriptContext *)jsReentLock._24_8_;
    BVar5 = BigIndex::SetItem((BigIndex *)auStack_78,(RecyclableObject *)jsReentLock._24_8_,
                              args[uVar12],PropertyOperation_ThrowIfNotExtensible);
    JsReentLock::MutateArrayObject((JsReentLock *)local_60);
    *(bool *)((long)local_60 + 0x108) = true;
    if (BVar5 == 0) {
      bVar4 = ThreadContext::RecordImplicitException(scriptContext->threadContext);
      if (bVar4) {
        JavascriptError::ThrowTypeError(scriptContext,-0x7ff5fe43,L"Array.prototype.push");
      }
      goto LAB_00b779f9;
    }
  }
LAB_00b7793b:
  scriptContext_01 = (ScriptContext *)jsReentLock._24_8_;
  *(undefined1 *)((long)local_60 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
  pvVar7 = BigIndex::ToNumber((BigIndex *)auStack_78,scriptContext_00);
  BVar5 = JavascriptOperators::SetProperty
                    (scriptContext_01,(RecyclableObject *)scriptContext_01,0xd1,pvVar7,scriptContext
                     ,PropertyOperation_ThrowIfNotExtensible);
  JsReentLock::MutateArrayObject((JsReentLock *)local_60);
  *(bool *)((long)local_60 + 0x108) = true;
  if (BVar5 != 0) {
    pvVar7 = BigIndex::ToNumber((BigIndex *)auStack_78,scriptContext_01);
    goto LAB_00b779fc;
  }
  bVar4 = ThreadContext::RecordImplicitException(scriptContext->threadContext);
  if (bVar4) {
    JavascriptError::ThrowTypeError(scriptContext,-0x7ff5fe43,L"Array.prototype.push");
  }
LAB_00b779f9:
  pvVar7 = (Var)0x0;
LAB_00b779fc:
  *(undefined1 *)((long)local_60 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
  return pvVar7;
}

Assistant:

Var JavascriptArray::EntryPushNonJavascriptArray(ScriptContext * scriptContext, Var * args, uint argCount)
    {
        JS_REENTRANCY_LOCK(jsReentLock, scriptContext->GetThreadContext());

        RecyclableObject* obj = nullptr;
        if (FALSE == JavascriptConversion::ToObject(args[0], scriptContext, &obj))
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_This_NullOrUndefined, _u("Array.prototype.push"));
        }
        SETOBJECT_FOR_MUTATION(jsReentLock, obj);

        JS_REENTRANT_UNLOCK(jsReentLock, Var length = JavascriptOperators::OP_GetLength(obj, scriptContext));
        if(JavascriptOperators::GetTypeId(length) == TypeIds_Undefined && scriptContext->GetThreadContext()->IsDisableImplicitCall() &&
            scriptContext->GetThreadContext()->GetImplicitCallFlags() != Js::ImplicitCall_None)
        {
            return length;
        }

        ThrowTypeErrorOnFailureHelper h(scriptContext, _u("Array.prototype.push"));
        BigIndex n;
        if (scriptContext->GetConfig()->IsES6ToLengthEnabled())
        {
            n = (uint64) JavascriptConversion::ToLength(length, scriptContext);
        }
        else
        {
            n = JavascriptConversion::ToUInt32(length, scriptContext);
        }
        // First handle "small" indices.
        uint index;
        for (index=1; index < argCount && n < JavascriptArray::MaxArrayLength; ++index, ++n)
        {
            JS_REENTRANT(jsReentLock,
                BOOL setItem = JavascriptOperators::SetItem(obj, obj, n.GetSmallIndex(), args[index], scriptContext, PropertyOperation_ThrowIfNotExtensible));
            if (h.IsThrowTypeError(setItem))
            {
                if (scriptContext->GetThreadContext()->RecordImplicitException())
                {
                    h.ThrowTypeErrorOnFailure();
                }
                else
                {
                    return nullptr;
                }
            }
        }

        // Use BigIndex if we need to push indices >= MaxArrayLength
        if (index < argCount)
        {
            BigIndex big = n;

            for (; index < argCount; ++index, ++big)
            {
                JS_REENTRANT(jsReentLock, BOOL setItem = big.SetItem(obj, args[index], PropertyOperation_ThrowIfNotExtensible));
                if (h.IsThrowTypeError(setItem))
                {
                    if(scriptContext->GetThreadContext()->RecordImplicitException())
                    {
                        h.ThrowTypeErrorOnFailure();
                    }
                    else
                    {
                        return nullptr;
                    }
                }

            }

            // Set the new length; for objects it is all right for this to be >= MaxArrayLength
            JS_REENTRANT(jsReentLock,
                BOOL setLength = JavascriptOperators::SetProperty(obj, obj, PropertyIds::length, big.ToNumber(scriptContext), scriptContext, PropertyOperation_ThrowIfNotExtensible));
            if (h.IsThrowTypeError(setLength))
            {
                if(scriptContext->GetThreadContext()->RecordImplicitException())
                {
                    h.ThrowTypeErrorOnFailure();
                }
                else
                {
                    return nullptr;
                }
            }

            return big.ToNumber(scriptContext);
        }
        else
        {
            // Set the new length
            Var lengthAsNUmberVar = JavascriptNumber::ToVar(n.IsSmallIndex() ? n.GetSmallIndex() : n.GetBigIndex(), scriptContext);
            JS_REENTRANT(jsReentLock,
                BOOL setLength = JavascriptOperators::SetProperty(obj, obj, PropertyIds::length, lengthAsNUmberVar, scriptContext, PropertyOperation_ThrowIfNotExtensible));
            if (h.IsThrowTypeError(setLength))
            {
                if(scriptContext->GetThreadContext()->RecordImplicitException())
                {
                    h.ThrowTypeErrorOnFailure();
                }
                else
                {
                    return nullptr;
                }
            }

            return lengthAsNUmberVar;
        }
    }